

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86.cpp
# Opt level: O0

void ncnn::binary_op_no_broadcast(Mat *a,Mat *b,Mat *c,int op_type,Option *opt)

{
  long *in_RDX;
  long *in_RSI;
  long *in_RDI;
  float *outptr;
  float *ptr1;
  float *ptr;
  int q;
  int size;
  int channels;
  Mat *m_1;
  Mat *m;
  Mat *m_2;
  int in_stack_fffffffffffffbf4;
  float *in_stack_fffffffffffffc08;
  float local_390 [8];
  long local_370;
  undefined4 local_368;
  undefined4 local_364;
  undefined4 local_360;
  undefined4 local_35c;
  undefined4 local_358;
  undefined8 local_350;
  float *local_348;
  undefined8 local_340;
  undefined8 local_338;
  undefined8 local_330;
  undefined4 local_328;
  long local_320;
  undefined4 local_318;
  undefined4 local_314;
  undefined4 local_310;
  undefined4 local_30c;
  undefined4 local_308;
  undefined8 local_300;
  long local_2f8;
  undefined8 local_2e0;
  undefined8 local_2d8;
  undefined8 local_2d0;
  undefined4 local_2c8;
  long local_2c0;
  undefined4 local_2b8;
  undefined4 local_2b4;
  undefined4 local_2b0;
  undefined4 local_2ac;
  undefined4 local_2a8;
  undefined8 local_2a0;
  long local_298;
  int local_28c;
  int local_288;
  int local_284;
  long *local_270;
  long *local_268;
  long *local_260;
  undefined8 *local_258;
  undefined8 *local_248;
  float *local_238;
  float *local_210;
  undefined8 *local_1f0;
  undefined8 *local_1d0;
  undefined1 local_195;
  int local_194;
  undefined8 *local_188;
  undefined1 local_15d;
  int local_15c;
  undefined8 *local_150;
  undefined8 *local_128;
  undefined8 *local_120;
  undefined1 local_115;
  int local_114;
  float *local_108;
  float *local_e0;
  long local_d8;
  undefined4 local_cc;
  long local_c8;
  float *local_c0;
  undefined4 local_b4;
  int local_b0;
  int local_ac;
  float *local_a8;
  long local_a0;
  undefined4 local_94;
  long local_90;
  long local_88;
  undefined4 local_7c;
  int local_78;
  int local_74;
  undefined8 *local_70;
  long local_68;
  undefined4 local_5c;
  long local_58;
  long local_50;
  undefined4 local_44;
  int local_40;
  int local_3c;
  undefined8 *local_38;
  undefined4 local_2c;
  long local_28;
  undefined4 local_1c;
  long local_18;
  undefined4 local_c;
  long local_8;
  
  local_284 = (int)in_RDI[7];
  local_288 = *(int *)((long)in_RDI + 0x2c) * (int)in_RDI[6] * *(int *)((long)in_RDI + 0x34) *
              (int)in_RDI[3];
  local_270 = in_RDX;
  local_268 = in_RSI;
  local_260 = in_RDI;
  for (local_28c = 0; local_28c < local_284; local_28c = local_28c + 1) {
    local_150 = &local_2e0;
    local_74 = *(int *)((long)local_260 + 0x2c);
    local_78 = (int)local_260[6];
    local_7c = *(undefined4 *)((long)local_260 + 0x34);
    local_298 = *local_260 + local_260[8] * (long)local_28c * local_260[2];
    local_90 = local_260[2];
    local_94 = (undefined4)local_260[3];
    local_a0 = local_260[4];
    local_70 = &local_2e0;
    local_18 = (long)local_74 * (long)local_78 * local_90;
    local_120 = &local_2e0;
    local_258 = &local_2e0;
    local_188 = &local_340;
    local_3c = *(int *)((long)local_268 + 0x2c);
    local_40 = (int)local_268[6];
    local_44 = *(undefined4 *)((long)local_268 + 0x34);
    local_2f8 = *local_268 + local_268[8] * (long)local_28c * local_268[2];
    local_58 = local_268[2];
    local_5c = (undefined4)local_268[3];
    local_68 = local_268[4];
    local_38 = &local_340;
    local_28 = (long)local_3c * (long)local_40 * local_58;
    local_128 = &local_340;
    local_248 = &local_340;
    local_2a8 = 0;
    local_2ac = 0;
    local_2b0 = 0;
    local_2b4 = 0;
    local_2c8 = 0;
    local_2d0 = 0;
    local_2d8 = 0;
    local_2e0 = 0;
    local_1c = 0x10;
    local_2c = 0x10;
    local_15c = local_28c;
    local_15d = 1;
    local_194 = local_28c;
    local_195 = 1;
    local_2a0 = 0;
    local_2b8 = 0;
    local_340 = 0;
    local_330 = 0;
    local_328 = 0;
    local_318 = 0;
    local_314 = 0;
    local_310 = 0;
    local_30c = 0;
    local_308 = 0;
    local_300 = 0;
    local_338 = 0;
    local_108 = local_390;
    local_ac = *(int *)((long)local_270 + 0x2c);
    local_b0 = (int)local_270[6];
    local_b4 = *(undefined4 *)((long)local_270 + 0x34);
    local_348 = (float *)(*local_270 + local_270[8] * (long)local_28c * local_270[2]);
    local_c8 = local_270[2];
    local_cc = (undefined4)local_270[3];
    local_d8 = local_270[4];
    local_a8 = local_390;
    local_8 = (long)local_ac * (long)local_b0 * local_c8;
    local_e0 = local_390;
    local_238 = local_390;
    local_c = 0x10;
    local_114 = local_28c;
    local_115 = 1;
    local_390[0] = 0.0;
    local_390[1] = 0.0;
    local_390[4] = 0.0;
    local_390[5] = 0.0;
    local_390[6] = 0.0;
    local_368 = 0;
    local_364 = 0;
    local_360 = 0;
    local_35c = 0;
    local_358 = 0;
    local_350 = 0;
    local_390[2] = 0.0;
    local_390[3] = 0.0;
    local_210 = local_238;
    local_1f0 = local_248;
    local_1d0 = local_258;
    local_c0 = local_348;
    local_88 = local_298;
    local_50 = local_2f8;
    local_370 = local_d8;
    local_320 = local_68;
    local_2c0 = local_a0;
    binary_op_vector(local_a8,in_stack_fffffffffffffc08,local_348,(int)((ulong)local_238 >> 0x20),
                     (int)local_238,in_stack_fffffffffffffbf4,(int)local_248,(int)local_2f8);
  }
  return;
}

Assistant:

static void binary_op_no_broadcast(const Mat& a, const Mat& b, Mat& c, int op_type, const Option& opt)
{
    const int channels = a.c;
    const int size = a.w * a.h * a.d * a.elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = a.channel(q);
        const float* ptr1 = b.channel(q);
        float* outptr = c.channel(q);

        binary_op_vector(ptr, ptr1, outptr, size, size, 1, 1, op_type);
    }
}